

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O0

void __thiscall CTcSymFunc::gen_code(CTcSymFunc *this,int discard)

{
  CTcDataStream *in_RDI;
  CTcSymFuncBase *unaff_retaddr;
  uchar in_stack_000000df;
  CTcGenTarg *in_stack_000000e0;
  
  CTcGenTarg::write_op(in_stack_000000e0,in_stack_000000df);
  CTcSymFuncBase::add_abs_fixup(unaff_retaddr,in_RDI);
  CTcDataStream::write4((CTcDataStream *)unaff_retaddr,(ulong)in_RDI);
  CTcGenTarg::note_push((CTcGenTarg *)0x282e1f);
  return;
}

Assistant:

void CTcSymFunc::gen_code(int discard)
{
    /* 
     *   function address are always unknown during code generation;
     *   generate a placeholder instruction and add a fixup record for it 
     */
    G_cg->write_op(OPC_PUSHFNPTR);

    /* add a fixup for the current code location */
    add_abs_fixup(G_cs);

    /* write a placeholder offset - arbitrarily use zero */
    G_cs->write4(0);

    /* note the push */
    G_cg->note_push();
}